

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

CTcSymbol * CTcSymEnumBase::read_from_sym_file(CVmFile *fp)

{
  undefined1 *puVar1;
  CTcPrsSymtab *this;
  ulong id;
  char *__s;
  size_t sVar2;
  CTcSymEnum *this_00;
  char *siz;
  char buf [32];
  
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    this_00 = (CTcSymEnum *)0x0;
  }
  else {
    CVmFile::read_bytes(fp,buf,1);
    this = G_prs->global_symtab_;
    sVar2 = strlen(__s);
    siz = __s;
    this_00 = (CTcSymEnum *)CTcPrsSymtab::find(this,__s,sVar2);
    if ((this_00 == (CTcSymEnum *)0x0) ||
       (*(int *)&((CVmHashEntry *)
                 &(this_00->super_CTcSymEnumBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
        != 10)) {
      this_00 = (CTcSymEnum *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)siz);
      sVar2 = strlen(__s);
      id = G_prs->next_enum_id_;
      G_prs->next_enum_id_ = id + 1;
      CTcSymEnum::CTcSymEnum(this_00,__s,sVar2,0,id,(byte)buf[0] & 1);
    }
    else if ((char)((byte)buf[0] & 1) != '\0') {
      puVar1 = &(this_00->super_CTcSymEnumBase).field_0x30;
      *puVar1 = *puVar1 | 1;
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymEnumBase::read_from_sym_file(CVmFile *fp)
{
    const char *sym;
    CTcSymEnum *old_entry;
    char buf[32];
    int is_token;

    /* read the symbol name */
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the 'token' flag */
    fp->read_bytes(buf, 1);
    is_token = ((buf[0] & 1) != 0);

    /* 
     *   If this enumerator is already defined, this is a harmless
     *   redefinition - every symbol file can define the same enumerator
     *   without any problem.  Indicate the harmless redefinition by
     *   returning the original symbol.  
     */
    old_entry = (CTcSymEnum *)
                G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_ENUM)
    {
        /* if this is a 'token' enum, mark the old entry as such */
        if (is_token)
            old_entry->set_is_token(TRUE);

        /* return the original entry */
        return old_entry;
    }

    /* create and return the new symbol */
    return new CTcSymEnum(sym, strlen(sym), FALSE,
                          G_prs->new_enum_id(), is_token);
}